

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_polynomial_model.hpp
# Opt level: O1

void __thiscall
cimod::BinaryPolynomialModel<unsigned_int,_double>::RemoveInteraction
          (BinaryPolynomialModel<unsigned_int,_double> *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *key)

{
  unordered_map<unsigned_int,_unsigned_long,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
  *this_00;
  unordered_map<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long,_cimod::vector_hash,_std::equal_to<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long>_>_>
  *this_01;
  pointer *ppuVar1;
  double dVar2;
  pointer puVar3;
  ulong uVar4;
  mapped_type mVar5;
  mapped_type mVar6;
  pointer pvVar7;
  pointer pvVar8;
  pointer pdVar9;
  pointer pdVar10;
  pointer puVar11;
  const_iterator cVar12;
  mapped_type *pmVar13;
  mapped_type *pmVar14;
  mapped_type *pmVar15;
  uint *index;
  pointer puVar16;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  
  FormatPolynomialKey<unsigned_int>(key,&this->vartype_);
  this_01 = &this->poly_key_inv_;
  cVar12 = std::
           _Hashtable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::find(&this_01->_M_h,key);
  if (cVar12.
      super__Node_iterator_base<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long>,_true>
      ._M_cur != (__node_type *)0x0) {
    puVar16 = (key->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start;
    puVar3 = (key->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (puVar16 != puVar3) {
      this_00 = &this->each_variable_num_;
      do {
        pmVar13 = std::__detail::
                  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)this_00,puVar16);
        uVar4 = *pmVar13;
        pmVar13 = std::__detail::
                  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)this_00,puVar16);
        if (uVar4 < 2) {
          if (*pmVar13 == 1) {
            std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::_M_erase(&this_00->_M_h,puVar16);
            std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::_M_erase((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        *)this,puVar16);
            this->relabel_flag_for_variables_to_integers_ = true;
          }
        }
        else {
          *pmVar13 = *pmVar13 - 1;
        }
        puVar16 = puVar16 + 1;
      } while (puVar16 != puVar3);
    }
    pmVar14 = std::__detail::
              _Map_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)this_01,key);
    mVar5 = *pmVar14;
    pmVar14 = std::__detail::
              _Map_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)this_01,key);
    pmVar15 = std::__detail::
              _Map_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)this_01,
                           (this->poly_key_list_).
                           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish + -1);
    mVar6 = *pmVar14;
    *pmVar14 = *pmVar15;
    *pmVar15 = mVar6;
    std::
    _Hashtable<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_cimod::vector_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_erase(&this_01->_M_h,key);
    pvVar7 = (this->poly_key_list_).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar8 = (this->poly_key_list_).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    puVar16 = pvVar7[mVar5].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppuVar1 = (pointer *)
              ((long)&pvVar7[mVar5].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data + 8);
    puVar3 = *ppuVar1;
    puVar11 = ppuVar1[1];
    pvVar7[mVar5].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start =
         pvVar8[-1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start;
    *(pointer *)
     ((long)&pvVar7[mVar5].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data + 8) =
         pvVar8[-1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    *(pointer *)
     ((long)&pvVar7[mVar5].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data + 0x10) =
         pvVar8[-1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    pvVar8[-1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = puVar16;
    pvVar8[-1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar3;
    pvVar8[-1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = puVar11;
    (this->poly_key_list_).
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pvVar8 + -1;
    if (puVar16 != (pointer)0x0) {
      operator_delete(puVar16,(long)pvVar8[-1].
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)puVar16);
    }
    pdVar9 = (this->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar10 = (this->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
    dVar2 = pdVar9[mVar5];
    pdVar9[mVar5] = pdVar10[-1];
    pdVar10[-1] = dVar2;
    (this->poly_value_list_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar10 + -1;
  }
  return;
}

Assistant:

void RemoveInteraction( std::vector<IndexType> &key ) {
      FormatPolynomialKey( &key, vartype_ );
      if ( poly_key_inv_.count( key ) == 0 ) {
        return;
      }

      for ( const auto &index : key ) {
        if ( each_variable_num_[ index ] >= 2 ) {
          each_variable_num_[ index ]--;
        } else if ( each_variable_num_[ index ] == 1 ) {
          each_variable_num_.erase( index );
          variables_.erase( index );
          relabel_flag_for_variables_to_integers_ = true;
        }
      }

      std::size_t inv = poly_key_inv_[ key ];

      std::swap( poly_key_inv_[ key ], poly_key_inv_[ poly_key_list_.back() ] );
      poly_key_inv_.erase( key );

      std::swap( poly_key_list_[ inv ], poly_key_list_.back() );
      poly_key_list_.pop_back();

      std::swap( poly_value_list_[ inv ], poly_value_list_.back() );
      poly_value_list_.pop_back();
    }